

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O1

Mvc_Cover_t * Mvc_CoverFlipVar(Mvc_Cover_t *p,int iValue0,int iValue1)

{
  int *piVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  Mvc_Cover_t *pCover;
  Mvc_Cube_t *pMVar6;
  Mvc_Cube_t *pMVar7;
  uint uVar8;
  uint uVar9;
  Mvc_Cube_t *pCube;
  uint uVar10;
  Mvc_List_t *pList;
  
  if (iValue0 + 1 != iValue1) {
    __assert_fail("iValue0 + 1 == iValue1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/mvc/mvcUtils.c"
                  ,0x228,"Mvc_Cover_t *Mvc_CoverFlipVar(Mvc_Cover_t *, int, int)");
  }
  pCover = Mvc_CoverClone(p);
  pCube = (p->lCubes).pHead;
  if (pCube != (Mvc_Cube_t *)0x0) {
    uVar10 = 1 << ((byte)iValue0 & 0x1f);
    uVar8 = 1 << ((byte)iValue1 & 0x1f);
    iVar5 = iValue1 >> 5;
    bVar3 = (byte)iValue0 & 0x1f;
    bVar4 = (byte)iValue1 & 0x1f;
    do {
      pMVar6 = Mvc_CubeDup(pCover,pCube);
      pMVar7 = (Mvc_Cube_t *)&pCover->lCubes;
      if ((pCover->lCubes).pHead != (Mvc_Cube_t *)0x0) {
        pMVar7 = (pCover->lCubes).pTail;
      }
      pMVar7->pNext = pMVar6;
      (pCover->lCubes).pTail = pMVar6;
      pMVar6->pNext = (Mvc_Cube_t *)0x0;
      piVar1 = &(pCover->lCubes).nItems;
      *piVar1 = *piVar1 + 1;
      uVar2 = pMVar6->pData[iValue0 >> 5];
      uVar9 = pMVar6->pData[iVar5] & uVar8;
      if (((uVar2 & uVar10) == 0) || (uVar9 == 0)) {
        if ((uVar2 & uVar10) == 0 && uVar9 == 0) {
          __assert_fail("Value0 || Value1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/mvc/mvcUtils.c"
                        ,0x23a,"Mvc_Cover_t *Mvc_CoverFlipVar(Mvc_Cover_t *, int, int)");
        }
        uVar9 = uVar2 | uVar10;
        if ((pMVar6->pData[iVar5] & uVar8) == 0) {
          uVar9 = uVar2 & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
        }
        pMVar6->pData[iValue0 >> 5] = uVar9;
        uVar9 = pMVar6->pData[iVar5] & (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
        if ((uVar2 & uVar10) != 0) {
          uVar9 = pMVar6->pData[iVar5] | uVar8;
        }
        pMVar6->pData[iVar5] = uVar9;
      }
      pCube = pCube->pNext;
    } while (pCube != (Mvc_Cube_t *)0x0);
  }
  return pCover;
}

Assistant:

Mvc_Cover_t * Mvc_CoverFlipVar( Mvc_Cover_t * p, int iValue0, int iValue1 )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube, * pCubeCopy;
    int Value0, Value1, Temp;

    assert( iValue0 + 1 == iValue1 ); // should be adjacent

    // clone the cover
    pCover = Mvc_CoverClone( p );
    // copy the cube list
    Mvc_CoverForEachCube( p, pCube )
    {
        pCubeCopy = Mvc_CubeDup( pCover, pCube );
        Mvc_CoverAddCubeTail( pCover, pCubeCopy );

        // get the bits
        Value0 = Mvc_CubeBitValue( pCubeCopy, iValue0 );
        Value1 = Mvc_CubeBitValue( pCubeCopy, iValue1 );

        // if both bits are one, nothing to swap
        if ( Value0 && Value1 )
            continue;
        // cannot be both zero because they belong to the same var
        assert( Value0 || Value1 ); 

        // swap the bits
        Temp   = Value0;
        Value0 = Value1;
        Value1 = Temp;

        // set the bits after the swap
        if ( Value0 )
            Mvc_CubeBitInsert( pCubeCopy, iValue0 );
        else
            Mvc_CubeBitRemove( pCubeCopy, iValue0 );

        if ( Value1 )
            Mvc_CubeBitInsert( pCubeCopy, iValue1 );
        else
            Mvc_CubeBitRemove( pCubeCopy, iValue1 );
    }
    return pCover;
}